

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFileEqnStorage.cpp
# Opt level: O0

void __thiscall
TPZFileEqnStorage<long_double>::Store
          (TPZFileEqnStorage<long_double> *this,int ieq,int jeq,char *name)

{
  char *in_RCX;
  int64_t currentpos;
  int64_t sizereturn;
  int iblock;
  double readvec [4] [100];
  int64_t firstpos;
  int64_t fPos [5];
  double val;
  double number;
  FILE *out_file;
  int i;
  int loop_limit;
  long local_d10;
  size_t local_d08;
  int local_cfc;
  undefined1 local_cf8 [3208];
  long local_70;
  long local_68 [6];
  double local_38;
  double local_30;
  FILE *local_28;
  int local_20;
  int local_1c;
  char *local_18;
  
  local_1c = 100;
  local_18 = in_RCX;
  local_28 = fopen(in_RCX,"wb");
  local_30 = 2.1;
  local_38 = 0.0;
  memset(local_68,0,0x28);
  local_70 = ftell(local_28);
  fwrite(local_68,8,5,local_28);
  local_d08 = 0;
  for (local_cfc = 0; local_cfc < 4; local_cfc = local_cfc + 1) {
    local_d10 = ftell(local_28);
    fseek(local_28,local_70 + (long)local_cfc * 8,0);
    fwrite(&local_d10,8,1,local_28);
    fseek(local_28,local_d10,0);
    for (local_20 = 0; local_20 < local_1c; local_20 = local_20 + 1) {
      local_38 = local_30 * (double)local_20 * (double)(local_cfc + 1);
      fwrite(&local_38,8,1,local_28);
    }
  }
  fclose(local_28);
  local_28 = fopen(local_18,"rb");
  local_d08 = fread(local_68,8,5,local_28);
  for (local_cfc = 0; local_cfc < 4; local_cfc = local_cfc + 1) {
    fseek(local_28,local_68[local_cfc],0);
    local_d08 = fread(local_cf8 + (long)local_cfc * 800,8,(long)local_1c,local_28);
  }
  return;
}

Assistant:

void TPZFileEqnStorage<TVar>::Store(int ieq, int jeq, const char *name){
	//Initial tests with C input output files !
	int loop_limit=100;// = jeq-ieq;
	int i;
	FILE *out_file = fopen(name,"wb");
	double number=2.1;
	double val = 0;
	int64_t fPos[5] = {0};
	int64_t firstpos = ftell(out_file);
	fwrite(fPos,sizeof(int64_t),5,out_file);
	double readvec[4][100];
	int iblock =0;
	int64_t sizereturn;
	sizereturn = 0;
	for(iblock=0; iblock<4; iblock++) {
		int64_t currentpos = ftell(out_file);
		fseek(out_file,firstpos+iblock*sizeof(int64_t),SEEK_SET);
		fwrite(&currentpos,sizeof(int64_t),1,out_file);
		fseek(out_file,currentpos,SEEK_SET);
		for(i=0;i<loop_limit;i++){
			val=number*i*(iblock+1);
			fwrite(&val, sizeof(double), 1, out_file);
		}
	}
	fclose(out_file);
	out_file = fopen(name,"rb");
	sizereturn = fread(fPos,sizeof(int64_t),5,out_file);
#ifdef PZDEBUG
	if (sizereturn != 5) DebugStop();
#endif
	for(iblock = 0; iblock<4; iblock++) {
		fseek(out_file,fPos[iblock],SEEK_SET);
		sizereturn = fread(readvec[iblock],sizeof(double),loop_limit,out_file);
#ifdef PZDEBUG
		if (sizereturn != loop_limit) DebugStop();
#endif
	}
}